

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

parser_error parse_renderer_combine(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *name;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getstr(p,"combine");
    iVar1 = ui_entry_combiner_lookup(name);
    *(int *)((long)pvVar3 + 0x3c) = iVar1;
    pVar2 = PARSE_ERROR_INVALID_VALUE;
    if (iVar1 != 0) {
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_renderer_combine(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *name;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "combine");
	renderer->combiner_index = ui_entry_combiner_lookup(name);
	return (renderer->combiner_index) ?
		PARSE_ERROR_NONE : PARSE_ERROR_INVALID_VALUE;
}